

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
VectorInstance::op_pushBack
          (VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  size_type sVar1;
  undefined8 *puVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  string *in_RDI;
  string *in_stack_00000020;
  string *in_stack_00000028;
  shared_ptr<Instance> instance;
  value_type *__x;
  string *this_00;
  allocator local_35 [13];
  value_type local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar1 != 1) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  __x = &local_28;
  get_shared_instance(in_stack_00000028,in_stack_00000020);
  std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::push_back
            ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
             this_00,__x);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_00,"null",local_35);
  std::allocator<char>::~allocator((allocator<char> *)local_35);
  std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1c03e2);
  return in_RDI;
}

Assistant:

std::string VectorInstance::op_pushBack(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    _value.push_back(instance);
    return "null";
}